

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_CreateDescriptor_wpkh_Test::TestBody(Descriptor_CreateDescriptor_wpkh_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  char *in_R9;
  AssertionResult gtest_ar_2;
  CfdException *except;
  Message local_950;
  string local_948;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_8f8;
  Message local_8f0;
  bool local_8e1;
  undefined1 local_8e0 [8];
  AssertionResult gtest_ar_;
  KeyData key;
  Message local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar;
  Message local_758;
  string local_750;
  AssertHelper local_730;
  Message local_728;
  Descriptor local_720;
  AssertHelper local_5b8;
  Message local_5b0 [2];
  string local_5a0;
  Pubkey local_580;
  DescriptorKeyInfo local_568;
  allocator local_3c1;
  string local_3c0 [8];
  string desc_str;
  Descriptor desc;
  DescriptorKeyInfo key_info;
  undefined1 local_90 [8];
  string pubkey_str;
  string local_68 [8];
  string parent_info;
  allocator local_31;
  string local_30 [8];
  string ext_descriptor;
  Descriptor_CreateDescriptor_wpkh_Test *this_local;
  
  ext_descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "wpkh([1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)#r5cw72t3"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"[1422fcb3/0\'/0\'/68\']",(allocator *)(pubkey_str.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(pubkey_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,"02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995"
             ,(allocator *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&desc.root_node_.parent_kind_.field_2 + 8));
  cfd::core::Descriptor::Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"",&local_3c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Pubkey::Pubkey(&local_580,(string *)local_90);
      std::__cxx11::string::string((string *)&local_5a0,local_68);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_568,&local_580,&local_5a0);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&desc.root_node_.parent_kind_.field_2 + 8),&local_568);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_568);
      std::__cxx11::string::~string((string *)&local_5a0);
      cfd::core::Pubkey::~Pubkey(&local_580);
    }
  }
  else {
    testing::Message::Message(local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d4,
               "Expected: key_info = DescriptorKeyInfo(Pubkey(pubkey_str), parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5b8,local_5b0);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    testing::Message::~Message(local_5b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::CreateDescriptor
                (&local_720,kDescriptorScriptWpkh,
                 (DescriptorKeyInfo *)((long)&desc.root_node_.parent_kind_.field_2 + 8),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=((Descriptor *)((long)&desc_str.field_2 + 8),&local_720);
      cfd::core::Descriptor::~Descriptor(&local_720);
    }
  }
  else {
    testing::Message::Message(&local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d5,
               "Expected: desc = Descriptor::CreateDescriptor(DescriptorScriptType::kDescriptorScriptWpkh, key_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    testing::Message::~Message(&local_728);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_750,(Descriptor *)((long)&desc_str.field_2 + 8),true);
      std::__cxx11::string::operator=(local_3c0,(string *)&local_750);
      std::__cxx11::string::~string((string *)&local_750);
    }
  }
  else {
    testing::Message::Message(&local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d6,
               "Expected: desc_str = desc.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_758);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_770,"desc_str.c_str()","ext_descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d7,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_778);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key.fingerprint_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  cfd::core::Descriptor::GetKeyData
            ((KeyData *)&gtest_ar_.message_,(Descriptor *)((long)&desc_str.field_2 + 8));
  local_8e1 = cfd::core::KeyData::IsValid((KeyData *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8e0,&local_8e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_8e0,(AssertionResult *)0x69fc11,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_8f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_948,(KeyData *)&gtest_ar_.message_,true,kApostrophe,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_928,"key.ToString().c_str()",
             "\"[1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995\""
             ,pcVar2,
             "[1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995"
            );
  std::__cxx11::string::~string((string *)&local_948);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(&local_950);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_950);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_.message_);
  std::__cxx11::string::~string(local_3c0);
  cfd::core::Descriptor::~Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&desc.root_node_.parent_kind_.field_2 + 8));
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, CreateDescriptor_wpkh) {
  std::string ext_descriptor = "wpkh([1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)#r5cw72t3";
  std::string parent_info = "[1422fcb3/0'/0'/68']";
  std::string pubkey_str = "02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995";
  DescriptorKeyInfo key_info;
  Descriptor desc;
  std::string desc_str = "";

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(Pubkey(pubkey_str), parent_info));
  EXPECT_NO_THROW(desc = Descriptor::CreateDescriptor(DescriptorScriptType::kDescriptorScriptWpkh, key_info));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), ext_descriptor.c_str());
  try {
    auto key = desc.GetKeyData();
    EXPECT_TRUE(key.IsValid());
    EXPECT_STREQ(key.ToString().c_str(),
      "[1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995");
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}